

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_mbox.hpp
# Opt level: O3

void __thiscall
so_5::impl::local_mbox_details::subscriber_adaptive_container_t::insert
          (subscriber_adaptive_container_t *this,subscriber_info_t info)

{
  __normal_iterator<so_5::impl::local_mbox_details::subscriber_info_t_*,_std::vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>_>
  __position;
  agent_t *local_20;
  
  if (this->m_storage == vector) {
    if ((long)(this->m_vector).
              super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->m_vector).
              super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x400) {
      switch_storage_to_map(this);
      if (this->m_storage != vector) goto LAB_002062e0;
    }
    __position = std::
                 __lower_bound<__gnu_cxx::__normal_iterator<so_5::impl::local_mbox_details::subscriber_info_t*,std::vector<so_5::impl::local_mbox_details::subscriber_info_t,std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>>>,so_5::impl::local_mbox_details::subscriber_info_t,__gnu_cxx::__ops::_Iter_less_val>
                           ((this->m_vector).
                            super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->m_vector).
                            super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&info);
    std::
    vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
    ::_M_insert_rval(&this->m_vector,(const_iterator)__position._M_current,&info);
  }
  else {
LAB_002062e0:
    local_20 = info.m_agent;
    std::
    _Rb_tree<so_5::agent_t*,std::pair<so_5::agent_t*const,so_5::impl::local_mbox_details::subscriber_info_t>,std::_Select1st<std::pair<so_5::agent_t*const,so_5::impl::local_mbox_details::subscriber_info_t>>,so_5::impl::local_mbox_details::subscriber_adaptive_container_t::agent_ptr_compare_type,std::allocator<std::pair<so_5::agent_t*const,so_5::impl::local_mbox_details::subscriber_info_t>>>
    ::_M_emplace_unique<so_5::agent_t*&,so_5::impl::local_mbox_details::subscriber_info_t>
              ((_Rb_tree<so_5::agent_t*,std::pair<so_5::agent_t*const,so_5::impl::local_mbox_details::subscriber_info_t>,std::_Select1st<std::pair<so_5::agent_t*const,so_5::impl::local_mbox_details::subscriber_info_t>>,so_5::impl::local_mbox_details::subscriber_adaptive_container_t::agent_ptr_compare_type,std::allocator<std::pair<so_5::agent_t*const,so_5::impl::local_mbox_details::subscriber_info_t>>>
                *)&this->m_map,&local_20,&info);
  }
  return;
}

Assistant:

void
	insert( subscriber_info_t info )
		{
			if( is_vector() )
				{
					if( m_vector.size() == size_limits::switch_to_map )
						switch_storage_to_map();
				}

			if( is_vector() )
				insert_to_vector( std::move( info ) );
			else
				insert_to_map( std::move( info ) );
		}